

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_pcmpgtw_mips64el(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar1 = 0;
  do {
    *(uint *)((long)&vs + lVar1 * 4) =
         -(uint)(*(uint *)((long)&vt + lVar1 * 4) < *(uint *)((long)&vs + lVar1 * 4));
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return vs.d;
}

Assistant:

uint64_t helper_pcmpgtw(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 2; i++) {
        vs.uw[i] = -(vs.uw[i] > vt.uw[i]);
    }
    return vs.d;
}